

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
EmplaceHint<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>_>
::TestBody(EmplaceHint<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  mt19937_64 *__urng;
  long lVar3;
  char *pcVar4;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> pVar5;
  T val2;
  AssertionResult gtest_ar;
  TypeParam m;
  _Head_base<0UL,_const_phmap::priv::hash_internal::EnumClass_&,_false> local_780;
  _Head_base<0UL,_const_int_&,_false> local_778;
  AssertHelper local_770 [2];
  result_type_conflict1 local_760 [2];
  undefined1 local_758 [8];
  Inner *local_750 [2];
  anon_union_8_1_a8a14541_for_iterator_1 local_740 [4];
  pair<const_phmap::priv::hash_internal::EnumClass,_int> local_720;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_710;
  
  pVar5 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    ((Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> *
                     )&local_710);
  local_720.first = pVar5.first;
  local_778._M_head_impl = &local_720.second;
  local_720.second = pVar5.second;
  lVar3 = 0x68;
  do {
    *(undefined8 *)((long)local_750 + lVar3 + 8) = 0;
    *(undefined8 *)((long)local_740 + lVar3) = 0;
    *(undefined8 *)(local_758 + lVar3) = 0;
    *(undefined8 *)((long)local_750 + lVar3) = 0;
    *(undefined8 *)((long)local_760 + lVar3 + -8) = 0;
    *(undefined8 *)((long)local_760 + lVar3) = 0;
    *(undefined8 *)((long)&local_770[-1].data_ + lVar3) = 0;
    *(undefined8 *)((long)&local_770[0].data_ + lVar3) = 0;
    *(undefined8 *)((long)local_740 + lVar3 + 8) = 0;
    *(undefined8 *)((long)local_740 + lVar3 + 0x18) = 0;
    *(long *)((long)local_710.sets_._M_elems + lVar3 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_710.sets_._M_elems + lVar3 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)
     ((long)&local_710.sets_._M_elems[0].super_Lockable.super_mutex.super___mutex_base._M_mutex +
     lVar3) = 0;
    lVar3 = lVar3 + 0x70;
  } while (lVar3 != 0x768);
  local_780._M_head_impl = &local_720.first;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_720.first;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::
  emplace_decomposable_with_hash<phmap::priv::hash_internal::EnumClass,std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::EnumClass_const&>,std::tuple<int_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool>
              *)local_758,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&local_710,local_780._M_head_impl,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,
             (tuple<const_phmap::priv::hash_internal::EnumClass_&> *)&local_780,
             (tuple<const_int_&> *)&local_778);
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::pair<phmap::priv::hash_internal::EnumClass_const,int>>
            ((internal *)local_758,"val","*it",&local_720,
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_740[0].slot_);
  if (local_758[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_780);
    if (local_750[0] == (Inner *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)(local_750[0]->super_Lockable).super_mutex.super___mutex_base._M_mutex.
                       __align;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_770 + 1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x98,pcVar4);
    testing::internal::AssertHelper::operator=(local_770 + 1,(Message *)&local_780);
    testing::internal::AssertHelper::~AssertHelper(local_770 + 1);
    if ((pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_780._M_head_impl !=
        (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)0x0) {
      (**(code **)(*local_780._M_head_impl + 8))();
    }
  }
  if (local_750[0] != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_750,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_750[0]);
  }
  local_758._0_4_ = 0;
  local_758._4_4_ = 0x7fffffff;
  __urng = hash_internal::GetSharedRng();
  local_760[0] = std::uniform_int_distribution<int>::operator()
                           ((uniform_int_distribution<int> *)local_758,__urng,
                            (param_type *)local_758);
  local_778._M_head_impl = local_760;
  local_770[1].data_ = (AssertHelperData *)local_720.first;
  local_780._M_head_impl = (EnumClass *)(local_770 + 1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_720.first;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::
  emplace_decomposable_with_hash<phmap::priv::hash_internal::EnumClass,std::piecewise_construct_t_const&,std::tuple<phmap::priv::hash_internal::EnumClass_const&>,std::tuple<int_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::iterator,_bool>
              *)local_758,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&local_710,local_780._M_head_impl,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,
             (tuple<const_phmap::priv::hash_internal::EnumClass_&> *)&local_780,
             (tuple<const_int_&> *)&local_778);
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::pair<phmap::priv::hash_internal::EnumClass_const,int>>
            ((internal *)local_758,"val","*it",&local_720,
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_740[0].slot_);
  if (local_758[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_780);
    if (local_750[0] == (Inner *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)(local_750[0]->super_Lockable).super_mutex.super___mutex_base._M_mutex.
                       __align;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_770,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x9b,pcVar4);
    testing::internal::AssertHelper::operator=(local_770,(Message *)&local_780);
    testing::internal::AssertHelper::~AssertHelper(local_770);
    if ((AssertHelper *)local_780._M_head_impl != (AssertHelper *)0x0) {
      (*(code *)((AssertHelperData *)*local_780._M_head_impl)->file)();
    }
  }
  if (local_750[0] != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_750,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_750[0]);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~parallel_hash_set(&local_710);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, EmplaceHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  // TODO(alkis): We need a way to run emplace in a more meaningful way. Perhaps
  // with test traits/policy.
  auto it = m.emplace_hint(m.end(), val);
  EXPECT_EQ(val, *it);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  it = m.emplace_hint(it, val2);
  EXPECT_EQ(val, *it);
}